

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

int __thiscall libchars::editor::print(editor *this)

{
  terminal_driver *ptVar1;
  edit_object *peVar2;
  edit_object *this_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  void *pvVar7;
  size_t sVar8;
  char *pcVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  debug *pdVar11;
  long lVar12;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  size_t sVar13;
  terminal_driver *__n;
  ulong uVar14;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  size_t local_270;
  ulong local_178;
  size_t local_158;
  size_t local_110;
  size_t y;
  size_t x;
  size_t rendered_1;
  auto_cursor ___1;
  size_t rendered;
  auto_cursor local_d0;
  auto_cursor __;
  size_t to;
  size_t idx_to;
  size_t search_to;
  size_t space;
  size_t search_from;
  size_t from;
  size_t idx_from;
  size_t render_length_1;
  size_t end_1;
  size_t start_1;
  size_t cursor;
  size_t window;
  size_t rows;
  size_t cols;
  size_t render_length;
  size_t end;
  size_t start;
  size_t n_to_write;
  editor *this_local;
  
  this->state = IDLE;
  if (this->obj->mode == MODE_MULTILINE) {
    if (this->obj->prompt_rendered == 0) {
      ptVar1 = this->driver;
      sVar6 = std::__cxx11::string::data();
      sVar13 = sVar6;
      pvVar7 = (void *)std::__cxx11::string::length();
      terminal_driver::write(ptVar1,(int)sVar6,pvVar7,sVar13);
      sVar8 = std::__cxx11::string::length();
      this->obj->prompt_rendered = sVar8;
    }
    if (this->obj->insert_idx <= this->obj->cursor) {
      return 0;
    }
    sVar8 = this->obj->insert_idx;
    sVar10 = this->obj->cursor;
    ptVar1 = this->driver;
    __n = ptVar1;
    pcVar9 = edit_object::data(this->obj);
    terminal_driver::write
              (ptVar1,(int)pcVar9 + (int)this->obj->cursor,(void *)(sVar8 - sVar10),(size_t)__n);
    this->obj->cursor = this->obj->insert_idx;
    return 0;
  }
  bVar3 = terminal_driver::control(this->driver);
  if (!bVar3) {
    if (this->obj->prompt_rendered == 0) {
      ptVar1 = this->driver;
      sVar6 = std::__cxx11::string::data();
      sVar13 = sVar6;
      pvVar7 = (void *)std::__cxx11::string::length();
      terminal_driver::write(ptVar1,(int)sVar6,pvVar7,sVar13);
      sVar8 = std::__cxx11::string::length();
      this->obj->prompt_rendered = sVar8;
    }
    if (this->obj->insert_idx <= this->obj->cursor) {
      return 0;
    }
    peVar2 = this->obj;
    sVar8 = edit_object::idx(this->obj,this->obj->cursor);
    iVar4 = (*peVar2->_vptr_edit_object[0xc])(peVar2,sVar8);
    peVar2 = this->obj;
    sVar8 = edit_object::idx(this->obj,this->obj->insert_idx + 1);
    iVar5 = (*peVar2->_vptr_edit_object[0xc])(peVar2,sVar8);
    if ((this->obj->mode == MODE_PASSWORD) ||
       (CONCAT44(extraout_var_00,iVar5) <= CONCAT44(extraout_var,iVar4))) {
      local_158 = 0;
    }
    else {
      local_158 = CONCAT44(extraout_var_00,iVar5) - CONCAT44(extraout_var,iVar4);
    }
    sVar8 = render(this,this->obj->cursor,local_158);
    this->obj->cursor = sVar8 + this->obj->cursor;
    return 0;
  }
  sVar8 = terminal_driver::columns(this->driver);
  sVar10 = terminal_driver::rows(this->driver);
  if ((sVar8 == 0) || (sVar10 == 0)) {
    return -2;
  }
  if ((sVar8 < 2) && (sVar10 < 2)) {
    return -3;
  }
  uVar14 = sVar8 * sVar10 - 1;
  peVar2 = this->obj;
  sVar10 = edit_object::idx(this->obj,this->obj->insert_idx);
  iVar4 = (*peVar2->_vptr_edit_object[0xd])(peVar2,sVar10);
  start_1 = CONCAT44(extraout_var_01,iVar4);
  peVar2 = this->obj;
  sVar10 = edit_object::idx(this->obj,this->obj->insert_idx);
  iVar4 = (*peVar2->_vptr_edit_object[0xc])(peVar2,sVar10);
  peVar2 = this->obj;
  sVar10 = edit_object::idx(this->obj,this->obj->insert_idx + 1);
  iVar5 = (*peVar2->_vptr_edit_object[0xc])(peVar2,sVar10);
  render_length_1 = CONCAT44(extraout_var_03,iVar5);
  if (this->obj->mode == MODE_PASSWORD) {
    local_178 = 0;
  }
  else {
    peVar2 = this->obj;
    this_00 = this->obj;
    sVar10 = edit_object::length(this->obj);
    sVar10 = edit_object::idx(this_00,sVar10);
    iVar5 = (*peVar2->_vptr_edit_object[0xc])(peVar2,sVar10);
    local_178 = CONCAT44(extraout_var_04,iVar5);
  }
  idx_from = local_178;
  end_1 = CONCAT44(extraout_var_02,iVar4);
  if (start_1 < CONCAT44(extraout_var_02,iVar4)) {
    end_1 = start_1;
  }
  if (render_length_1 < end_1) {
    render_length_1 = end_1;
  }
  if (uVar14 < start_1 - end_1) {
    start_1 = end_1;
  }
  pdVar11 = debug::initialize(0);
  debug::log(pdVar11,__x);
  lVar12 = std::__cxx11::string::length();
  if (uVar14 < local_178 + lVar12) {
    from = 0;
    search_from = 0;
    if (local_178 != 0) {
      if (render_length_1 - end_1 < uVar14) {
        if (uVar14 >> 1 < local_178 - start_1) {
          if (start_1 < uVar14 >> 1) {
            space = 0;
          }
          else {
            space = start_1 - (uVar14 >> 1);
          }
        }
        else if (uVar14 < local_178) {
          space = local_178 - uVar14;
        }
        else {
          space = 0;
        }
        pdVar11 = debug::initialize(0);
        debug::log(pdVar11,__x_00);
        if (space < end_1) {
          if (end_1 - space < this->obj->insert_idx) {
            from = this->obj->insert_idx - (end_1 - space);
          }
          else {
            from = 0;
          }
          peVar2 = this->obj;
          sVar8 = edit_object::idx(this->obj,from);
          iVar4 = (*peVar2->_vptr_edit_object[0xc])(peVar2,sVar8);
          search_from = CONCAT44(extraout_var_05,iVar4);
          if (space < search_from) {
            while (from != 0 && space < search_from) {
              from = from - 1;
              peVar2 = this->obj;
              sVar8 = edit_object::idx(this->obj,from);
              iVar4 = (*peVar2->_vptr_edit_object[0xc])(peVar2,sVar8);
              search_from = CONCAT44(extraout_var_06,iVar4);
            }
            if (search_from < space) {
              from = from + 1;
              peVar2 = this->obj;
              sVar8 = edit_object::idx(this->obj,from);
              iVar4 = (*peVar2->_vptr_edit_object[0xc])(peVar2,sVar8);
              search_from = CONCAT44(extraout_var_07,iVar4);
            }
          }
          else if (search_from < space) {
            while (from < this->obj->insert_idx && search_from < space) {
              from = from + 1;
              peVar2 = this->obj;
              sVar8 = edit_object::idx(this->obj,from);
              iVar4 = (*peVar2->_vptr_edit_object[0xc])(peVar2,sVar8);
              search_from = CONCAT44(extraout_var_08,iVar4);
            }
          }
        }
        else {
          from = this->obj->insert_idx;
          search_from = end_1;
        }
      }
      else {
        from = this->obj->insert_idx;
        search_from = end_1;
      }
      pdVar11 = debug::initialize(0);
      debug::log(pdVar11,__x_01);
      idx_to = search_from + uVar14;
      if (local_178 < idx_to) {
        idx_to = local_178;
      }
      to = this->obj->insert_idx;
      if (to < from) {
        to = from;
      }
      peVar2 = this->obj;
      sVar8 = edit_object::idx(this->obj,to + 1);
      iVar4 = (*peVar2->_vptr_edit_object[0xc])(peVar2,sVar8);
      __.driver = (terminal_driver *)CONCAT44(extraout_var_09,iVar4);
      pdVar11 = debug::initialize(0);
      debug::log(pdVar11,__x_02);
      if (render_length_1 < idx_to) {
        to = edit_object::idx(this->obj,this->obj->insert_idx + (idx_to - render_length_1));
        peVar2 = this->obj;
        sVar8 = edit_object::idx(this->obj,to + 1);
        iVar4 = (*peVar2->_vptr_edit_object[0xc])(peVar2,sVar8);
        __.driver = (terminal_driver *)CONCAT44(extraout_var_10,iVar4);
        if (__.driver < idx_to) {
          while (sVar8 = edit_object::length(this->obj), to < sVar8 && __.driver < idx_to) {
            peVar2 = this->obj;
            sVar8 = edit_object::idx(this->obj,to + 2);
            iVar4 = (*peVar2->_vptr_edit_object[0xc])(peVar2,sVar8);
            __.driver = (terminal_driver *)CONCAT44(extraout_var_11,iVar4);
            to = to + 1;
          }
          if ((idx_to < __.driver) && (this->obj->insert_idx < to)) {
            peVar2 = this->obj;
            sVar8 = edit_object::idx(this->obj,to);
            iVar4 = (*peVar2->_vptr_edit_object[0xc])(peVar2,sVar8);
            __.driver = (terminal_driver *)CONCAT44(extraout_var_12,iVar4);
          }
        }
        else if (idx_to < __.driver) {
          while (this->obj->insert_idx < to && idx_to < __.driver) {
            peVar2 = this->obj;
            sVar8 = edit_object::idx(this->obj,to);
            iVar4 = (*peVar2->_vptr_edit_object[0xc])(peVar2,sVar8);
            to = to - 1;
            __.driver = (terminal_driver *)CONCAT44(extraout_var_13,iVar4);
          }
        }
      }
      pdVar11 = debug::initialize(0);
      debug::log(pdVar11,__x_03);
      if (__.driver < search_from) {
        __.driver = (terminal_driver *)search_from;
      }
      else if (uVar14 < (long)__.driver - search_from) {
        __.driver = (terminal_driver *)(search_from + uVar14);
      }
      idx_from = (long)__.driver - search_from;
    }
    terminal_driver::auto_cursor::auto_cursor(&local_d0,this->driver);
    terminal_driver::clear_screen(this->driver);
    if (idx_from < uVar14) {
      this->obj->prompt_rendered = uVar14 - idx_from;
      ptVar1 = this->driver;
      iVar4 = std::__cxx11::string::data();
      sVar13 = std::__cxx11::string::length();
      pvVar7 = (void *)this->obj->prompt_rendered;
      terminal_driver::write(ptVar1,(iVar4 + (int)sVar13) - (int)pvVar7,pvVar7,sVar13);
      pdVar11 = debug::initialize(0);
      std::__cxx11::string::c_str();
      __x_04 = (double)std::__cxx11::string::length();
      debug::log(pdVar11,__x_04);
    }
    else {
      this->obj->prompt_rendered = 0;
      idx_from = uVar14;
    }
    sVar8 = render(this,from,idx_from);
    pdVar11 = debug::initialize(0);
    debug::log(pdVar11,__x_05);
    iVar4 = terminal_driver::set_new_xy(this->driver,start_1 - (search_from + sVar8));
    if (iVar4 < 0) {
      this_local._4_4_ = -1;
    }
    ___1.driver._5_3_ = 0;
    ___1.driver._4_1_ = iVar4 < 0;
    terminal_driver::auto_cursor::~auto_cursor(&local_d0);
  }
  else {
    pdVar11 = debug::initialize(0);
    debug::log(pdVar11,__x_06);
    iVar4 = terminal_driver::set_new_xy
                      (this->driver,-this->obj->prompt_rendered - this->obj->cursor);
    if (iVar4 < 0) {
      return -1;
    }
    terminal_driver::clear_to_end_of_screen(this->driver);
    lVar12 = std::__cxx11::string::length();
    if (lVar12 != 0) {
      ptVar1 = this->driver;
      sVar6 = std::__cxx11::string::data();
      sVar13 = sVar6;
      pvVar7 = (void *)std::__cxx11::string::length();
      terminal_driver::write(ptVar1,(int)sVar6,pvVar7,sVar13);
      pdVar11 = debug::initialize(0);
      debug::log(pdVar11,__x_07);
      this->obj->cursor = 0;
    }
    sVar10 = std::__cxx11::string::length();
    this->obj->prompt_rendered = sVar10;
    if (local_178 == 0) goto LAB_0013636d;
    terminal_driver::auto_cursor::auto_cursor((auto_cursor *)&rendered_1,this->driver);
    x = render(this,0,local_178);
    pdVar11 = debug::initialize(0);
    debug::log(pdVar11,__x_08);
    if ((this->obj->prompt_rendered + x) % sVar8 == 0) {
      terminal_driver::newline(this->driver);
    }
    iVar4 = terminal_driver::set_new_xy(this->driver,start_1 - x);
    if (iVar4 < 0) {
      this_local._4_4_ = -1;
    }
    ___1.driver._5_3_ = 0;
    ___1.driver._4_1_ = iVar4 < 0;
    terminal_driver::auto_cursor::~auto_cursor((auto_cursor *)&rendered_1);
  }
  if (___1.driver._4_4_ != 0) {
    return this_local._4_4_;
  }
LAB_0013636d:
  if (idx_from == 0) {
    local_270 = 0;
  }
  else {
    local_270 = start_1;
  }
  this->obj->cursor = local_270;
  pdVar11 = debug::initialize(0);
  bVar3 = debug::check_level(pdVar11,4);
  if ((bVar3) && (bVar3 = terminal_driver::control(this->driver), bVar3)) {
    terminal_driver::cursor_position(this->driver,&y,&local_110,-1);
    pdVar11 = debug::initialize(0);
    debug::log(pdVar11,__x_09);
  }
  return 0;
}

Assistant:

int editor::print()
    {
        state = IDLE;

        if (obj->mode == MODE_MULTILINE) {
            // render prompt (if not already rendered)
            if (obj->prompt_rendered == 0) {
                driver.write(obj->prompt.data(), obj->prompt.length());
                obj->prompt_rendered = obj->prompt.length();
            }
            // print from previous cursor up to current end-of-buffer
            if (obj->cursor < obj->insert_idx) {
                size_t n_to_write = (obj->insert_idx - obj->cursor);
                driver.write(obj->data() + obj->cursor, n_to_write);
                obj->cursor = obj->insert_idx;
            }
        }
        else if (!driver.control()) {
            // render prompt (if not already rendered)
            if (obj->prompt_rendered == 0) {
                driver.write(obj->prompt.data(), obj->prompt.length());
                obj->prompt_rendered = obj->prompt.length();
            }
            // render from previous position up to current end-of-buffer
            if (obj->cursor < obj->insert_idx) {
                size_t start = obj->terminal_idx(obj->idx(obj->cursor));
                size_t end = obj->terminal_idx(obj->idx(obj->insert_idx + 1));
                size_t render_length = (obj->mode == MODE_PASSWORD || end <= start) ? 0 : (end - start);
                obj->cursor += render(obj->cursor,render_length);
            }
        } 
        else {
          size_t cols = driver.columns();
          size_t rows = driver.rows();

          // invalid: no rows or columns
          if (cols == 0 || rows == 0)
              return -2;
          // do nothing if only 1 position available (1 x 1 terminal)
          if (cols <= 1 && rows <= 1)
              return -3;

          // calculate available terminal space (leave extra space at the end for the cursor to overflow into)
          size_t window = cols * rows - 1;

          // dump will be limited depending on available terminal space;
          // prompt will be shortened if terminal not big enough for full string

          size_t cursor = obj->terminal_cursor(obj->idx(obj->insert_idx));
          size_t start = obj->terminal_idx(obj->idx(obj->insert_idx));
          size_t end = obj->terminal_idx(obj->idx(obj->insert_idx + 1));

          size_t render_length = (obj->mode == MODE_PASSWORD) ? 0 : obj->terminal_idx(obj->idx(obj->length()));

          if (cursor < start)
              start = cursor;
          if (end < start)
              end = start;
          if ((cursor - start) > window)
              cursor = start;

          LC_LOG_VERBOSE("window[%zu:%zux%zu];start[%zu];cursor[%zu];end[%zu];render_len[%zu]",window,cols,rows,start,cursor,end,render_length);

          if ((render_length + obj->prompt.length()) > window) {
              size_t idx_from = 0;
              size_t from = 0;
              if (render_length > 0) {
                  if ((end - start) >= window) {
                      idx_from = obj->insert_idx;
                      from = start;
                  }
                  else {
                      size_t search_from = 0;
                      if ((render_length - cursor) <= window/2) { // <-- cursor in last 1/2 window
                          // find all complete expanded characters that fit into (window - (LENGTH - START)) before START
                          if (render_length > window)
                              search_from = render_length - window;
                          else
                              search_from = 0;
                      }
                      else if (cursor < window/2) { // <-- cursor in first 1/2 window
                          // find all complete expanded characters that fit into space before START
                          search_from = 0;
                      }
                      else {
                          search_from = cursor - window/2;
                      }
                      LC_LOG_VERBOSE("search_from[%zu];start[%zu]",search_from,start);

                      if (search_from < start) {
                          // start searching with assumption that render is 1:1 with buffer
                          size_t space = start - search_from;
                          if (space < obj->insert_idx)
                              idx_from = obj->insert_idx - space;
                          else
                              idx_from = 0;
                          // keep on comparing until rendered string fits in or until space runs out
                          from = obj->terminal_idx(obj->idx(idx_from));
                          if (from > search_from) {
                              // more space available; search backwards
                              while (idx_from > 0 && from > search_from) {
                                  --idx_from;
                                  from = obj->terminal_idx(obj->idx(idx_from));
                              }
                              if (from < search_from) {
                                  ++idx_from;
                                  from = obj->terminal_idx(obj->idx(idx_from));
                              }
                          }
                          else if (from < search_from) {
                              // used too much space; search forwards
                              while (idx_from < obj->insert_idx && from < search_from) {
                                  ++idx_from;
                                  from = obj->terminal_idx(obj->idx(idx_from));
                              }
                          }
                      }
                      else {
                          idx_from = obj->insert_idx;
                          from = start;
                      }
                  }

                  LC_LOG_VERBOSE("from[%zu];idx_from[%zu]",from,idx_from);

                  // find all expanded characters (even partial) that fit into (window - END) on and after END
                  size_t search_to = from + window;
                  if (search_to > render_length)
                      search_to = render_length;
                  size_t idx_to = obj->insert_idx;
                  if (idx_to < idx_from)
                      idx_to = idx_from;
                  size_t to = obj->terminal_idx(obj->idx(idx_to + 1));

                  LC_LOG_VERBOSE("search_to[%zu];end[%zu]",search_to,end);

                  if (search_to > end) {
                      // start searching with assumption that render is 1:1 with buffer
                      idx_to = obj->idx(obj->insert_idx + (search_to - end));
                      // keep on comparing until rendered string fits in or until space runs out
                      to = obj->terminal_idx(obj->idx(idx_to + 1));
                      if (to < search_to) {
                          // more space available; search forwards
                          while (idx_to < obj->length() && to < search_to) {
                              ++idx_to;
                              to = obj->terminal_idx(obj->idx(idx_to + 1));
                          }
                          if (to > search_to && idx_to > obj->insert_idx) {
                              --idx_to;
                              to = obj->terminal_idx(obj->idx(idx_to + 1));
                          }
                      }
                      else if (to > search_to) {
                          // used too much space; search backwards
                          while (idx_to > obj->insert_idx && to > search_to) {
                              --idx_to;
                              to = obj->terminal_idx(obj->idx(idx_to + 1));
                          }
                      }
                  }

                  LC_LOG_VERBOSE("to[%zu];idx_to[%zu]",to,idx_to);

                  if (to < from)
                      to = from;
                  else if ((to - from) > window)
                      to = from + window;

                  render_length = to - from;
              }

              // start printing in upper-left corner
              terminal_driver::auto_cursor __(driver);
              driver.clear_screen();

              // print partial prompt (if possible)
              if (render_length < window) {
                  obj->prompt_rendered = window - render_length;
                  driver.write(obj->prompt.data() + obj->prompt.length() - obj->prompt_rendered, obj->prompt_rendered);
                  LC_LOG_VERBOSE("prompt_rendered[%zu]:%s",obj->prompt_rendered,obj->prompt.c_str()+obj->prompt.length()-obj->prompt_rendered);
              }
              else {
                  obj->prompt_rendered = 0;
                  render_length = window;
              }

              // print line[idx_from..]
              size_t rendered = render(idx_from, render_length);
              // move to final cursor position (relative to current position)
              LC_LOG_VERBOSE("cursor[%zu];from[%zu];rendered[%zu]",cursor,from,rendered);
              if (driver.set_new_xy((ssize_t)cursor - (ssize_t)(from + rendered)) < 0)
                  return -1;
          }
          else {
              LC_LOG_VERBOSE("obj->cursor[%zu]",obj->cursor);

              // move cursor to start of prompt position (relative to current position)
              if (driver.set_new_xy(0 - (ssize_t)obj->cursor - (ssize_t)obj->prompt_rendered) < 0)
                  return -1;

              // clear area for printing (TODO: optimize by only clearing specific lines)
              driver.clear_to_end_of_screen();

              // render prompt
              if (obj->prompt.length() > 0) {
                  driver.write(obj->prompt.data(), obj->prompt.length());
                  LC_LOG_VERBOSE("cursor[%zu];prompt_rendered[%zu]",obj->cursor,obj->prompt_rendered);
                  obj->cursor = 0;
              }
              obj->prompt_rendered = obj->prompt.length();

              if (render_length > 0) {
                  // print line
                  terminal_driver::auto_cursor __(driver);
                  size_t rendered = render(0, render_length);
                  LC_LOG_VERBOSE("rendered[%zu]",rendered);

                  // hack to convince cursor to move to the start of the next line
                  // on a fully populated rendered line
                  if (((obj->prompt_rendered + rendered) % cols) == 0)
                      driver.newline();

                  // move to final cursor position (relative to current position)
                  if (driver.set_new_xy((ssize_t)cursor - (ssize_t)rendered) < 0)
                      return -1;
              }
          }

          obj->cursor = (render_length > 0) ? cursor : 0;

          if (LC_LOG_CHECK_LEVEL(debug::VERBOSE) && driver.control()) {
              size_t x,y;
              driver.cursor_position(x,y);
              LC_LOG_VERBOSE("obj->cursor[%zu];x[%zu],y[%zu]",obj->cursor,x,y);
          }
        }

        return 0;
    }